

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptRegularExpressionResult.cpp
# Opt level: O0

void Js::JavascriptRegularExpressionResult::SetMatch(JavascriptArray *arr,GroupInfo match)

{
  code *pcVar1;
  bool bVar2;
  PropertyId propertyId;
  undefined4 *puVar3;
  ScriptContext *scriptContext_00;
  Var value;
  ScriptContext *scriptContext;
  JavascriptArray *arr_local;
  GroupInfo match_local;
  
  arr_local = (JavascriptArray *)match;
  bVar2 = Is(arr);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptRegularExpressionResult.cpp"
                                ,0x37,"(JavascriptRegularExpressionResult::Is(arr))",
                                "JavascriptRegularExpressionResult::Is(arr)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  bVar2 = UnifiedRegex::GroupInfo::IsUndefined((GroupInfo *)&arr_local);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptRegularExpressionResult.cpp"
                                ,0x38,"(!match.IsUndefined())","!match.IsUndefined()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  scriptContext_00 = RecyclableObject::GetScriptContext((RecyclableObject *)arr);
  propertyId = PropertyRecord::GetPropertyId((PropertyRecord *)BuiltInPropertyRecords::index);
  value = JavascriptNumber::ToVar((uint32)arr_local,scriptContext_00);
  DynamicObject::SetSlot((DynamicObject *)arr,propertyId,false,1,value);
  return;
}

Assistant:

void JavascriptRegularExpressionResult::SetMatch(JavascriptArray* arr, const UnifiedRegex::GroupInfo match)
    {
        Assert(JavascriptRegularExpressionResult::Is(arr));
        Assert(!match.IsUndefined());

        ScriptContext* scriptContext = arr->GetScriptContext();
        arr->SetSlot(SetSlotArguments(BuiltInPropertyRecords::index.propertyRecord.GetPropertyId(), IndexIndex, JavascriptNumber::ToVar(match.offset, scriptContext)));
    }